

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanImplX11.cpp
# Opt level: O1

bool sf::priv::VulkanImplX11::isAvailable(bool requireGraphics)

{
  pointer pVVar1;
  int iVar2;
  undefined1 *puVar3;
  bool bVar4;
  undefined7 in_register_00000039;
  bool bVar6;
  pointer pVVar7;
  uint32_t extensionCount;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> extensionProperties;
  uint local_60;
  undefined4 local_5c;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_58;
  pointer local_38;
  bool bVar5;
  
  if (isAvailable(bool)::checked != '\0') goto LAB_0018dfb3;
  isAvailable(bool)::checked = '\x01';
  if ((anonymous_namespace)::wrapper == 0) {
    (anonymous_namespace)::wrapper = dlopen("libvulkan.so.1",1);
    if ((anonymous_namespace)::wrapper != 0) {
      DAT_001d9000 = dlsym((anonymous_namespace)::wrapper,"vkGetInstanceProcAddr");
      if (((DAT_001d9000 != 0) &&
          (_DAT_001d9008 =
                dlsym((anonymous_namespace)::wrapper,"vkEnumerateInstanceLayerProperties"),
          _DAT_001d9008 != 0)) &&
         (DAT_001d9010 = (code *)dlsym((anonymous_namespace)::wrapper,
                                       "vkEnumerateInstanceExtensionProperties"),
         DAT_001d9010 != (code *)0x0)) goto LAB_0018de29;
      dlclose((anonymous_namespace)::wrapper);
      (anonymous_namespace)::wrapper = 0;
    }
    isAvailable(bool)::computeAvailable = 0;
    isAvailable(bool)::graphicsAvailable = 0;
    goto LAB_0018dfb3;
  }
LAB_0018de29:
  isAvailable(bool)::computeAvailable = 1;
  isAvailable(bool)::graphicsAvailable = 1;
  local_58.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = 0;
  (*DAT_001d9010)(0,&local_60,0);
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::resize
            (&local_58,(ulong)local_60);
  (*DAT_001d9010)(0,&local_60,
                  local_58.
                  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                  _M_impl.super__Vector_impl_data._M_start);
  pVVar1 = local_58.
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pVVar7 = local_58.
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (local_58.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_58.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
LAB_0018def7:
    isAvailable(bool)::graphicsAvailable = 0;
  }
  else {
    local_5c = (undefined4)CONCAT71(in_register_00000039,requireGraphics);
    bVar5 = false;
    bVar4 = false;
    bVar6 = false;
    local_38 = local_58.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      iVar2 = strcmp(pVVar7->extensionName,"VK_KHR_surface");
      if (iVar2 == 0) {
        bVar6 = true;
      }
      else {
        iVar2 = strcmp(pVVar7->extensionName,"VK_KHR_xlib_surface");
        bVar4 = bVar5;
        if (iVar2 == 0) {
          bVar4 = true;
          bVar5 = bVar4;
        }
      }
      pVVar7 = pVVar7 + 1;
    } while (pVVar7 != pVVar1);
    requireGraphics = SUB41(local_5c,0);
    pVVar7 = local_38;
    if ((!bVar6) || (!bVar4)) goto LAB_0018def7;
  }
  if (pVVar7 != (pointer)0x0) {
    operator_delete(pVVar7);
  }
LAB_0018dfb3:
  puVar3 = &isAvailable(bool)::computeAvailable;
  if (requireGraphics != false) {
    puVar3 = &isAvailable(bool)::graphicsAvailable;
  }
  return (bool)*puVar3;
}

Assistant:

bool VulkanImplX11::isAvailable(bool requireGraphics)
{
    static bool checked = false;
    static bool computeAvailable = false;
    static bool graphicsAvailable = false;

    if (!checked)
    {
        checked = true;

        // Check if the library is available
        computeAvailable = wrapper.loadLibrary();

        // To check for instance extensions we don't need to differentiate between graphics and compute
        graphicsAvailable = computeAvailable;

        if (graphicsAvailable)
        {
            // Retrieve the available instance extensions
            std::vector<VkExtensionProperties> extensionProperties;

            uint32_t extensionCount = 0;

            wrapper.vkEnumerateInstanceExtensionProperties(0, &extensionCount, NULL);

            extensionProperties.resize(extensionCount);

            wrapper.vkEnumerateInstanceExtensionProperties(0, &extensionCount, &extensionProperties[0]);

            // Check if the necessary extensions are available
            bool has_VK_KHR_surface = false;
            bool has_VK_KHR_platform_surface = false;

            for (std::vector<VkExtensionProperties>::const_iterator iter = extensionProperties.begin(); iter != extensionProperties.end(); ++iter)
            {
                if (!std::strcmp(iter->extensionName, VK_KHR_SURFACE_EXTENSION_NAME))
                {
                    has_VK_KHR_surface = true;
                }
                else if (!std::strcmp(iter->extensionName, VK_KHR_XLIB_SURFACE_EXTENSION_NAME))
                {
                    has_VK_KHR_platform_surface = true;
                }
            }

            if (!has_VK_KHR_surface || !has_VK_KHR_platform_surface)
                graphicsAvailable = false;
        }
    }

    if (requireGraphics)
        return graphicsAvailable;

    return computeAvailable;
}